

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

void BZ2_compressBlock(EState *s,Bool_conflict is_last_block)

{
  UChar (*paUVar1) [258];
  short *psVar2;
  UChar UVar3;
  UChar UVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  int iVar57;
  int iVar58;
  UInt16 *pUVar59;
  bool bVar60;
  undefined4 *puVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  int iVar65;
  long lVar66;
  long lVar67;
  UInt32 *pUVar68;
  bool bVar69;
  int iVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  UInt16 *pUVar74;
  size_t sVar75;
  Bool_conflict *pBVar76;
  uint minLen;
  ulong uVar77;
  Int32 (*paIVar78) [258];
  UChar UVar79;
  undefined7 in_register_00000031;
  ulong uVar80;
  ulong uVar81;
  size_t __n;
  UChar *pUVar82;
  UChar (*paUVar83) [258];
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  UInt16 cost [6];
  Int32 fave [6];
  ulong local_1e0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  Int32 (*local_1a0) [258];
  UChar local_198 [24];
  ulong local_180;
  ulong local_178;
  undefined4 local_16c;
  Bool_conflict *local_168;
  UInt32 *local_160;
  size_t local_158;
  size_t local_150;
  UChar (*local_148) [258];
  ulong local_140;
  undefined4 local_138;
  
  if (0 < s->nblock) {
    uVar63 = s->blockCRC;
    s->blockCRC = ~uVar63;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar63;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    if (1 < s->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n");
    }
    BZ2_blockSort(s);
  }
  s->zbits = (UChar *)((long)s->nblock + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
  }
  if (s->nblock < 1) goto LAB_00420241;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  iVar62 = s->bsLive;
  if (7 < iVar62) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar70 = s->bsLive;
      iVar62 = iVar70 + -8;
      s->bsLive = iVar62;
    } while (0xf < iVar70);
  }
  local_16c = (int)CONCAT71(in_register_00000031,is_last_block);
  iVar62 = iVar62 + 1;
  s->bsLive = iVar62;
  iVar70 = s->origPtr;
  if (7 < iVar62) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar65 = s->bsLive;
      iVar62 = iVar65 + -8;
      s->bsLive = iVar62;
    } while (0xf < iVar65);
  }
  s->bsBuff = s->bsBuff | iVar70 << (8U - (char)iVar62 & 0x1f);
  s->bsLive = iVar62 + 0x18;
  pUVar68 = s->ptr;
  pUVar82 = s->block;
  pUVar59 = s->mtfv;
  s->nInUse = 0;
  lVar66 = -0x100;
  do {
    if (s->unseqToSeq[lVar66] != '\0') {
      iVar62 = s->nInUse;
      *(char *)((long)s->mtfFreq + lVar66 + -0x20) = (char)iVar62;
      s->nInUse = iVar62 + 1;
    }
    lVar66 = lVar66 + 1;
  } while (lVar66 != 0);
  iVar62 = s->nInUse;
  lVar66 = (long)iVar62;
  if (-2 < lVar66) {
    memset(s->mtfFreq,0,(ulong)(iVar62 + 2) << 2);
  }
  if (0 < iVar62) {
    lVar67 = 0;
    do {
      *(char *)((long)&local_138 + lVar67) = (char)lVar67;
      lVar67 = lVar67 + 1;
    } while (lVar66 != lVar67);
  }
  uVar81 = (ulong)(uint)s->nblock;
  if (s->nblock < 1) {
    uVar63 = 0;
    iVar70 = 0;
  }
  else {
    lVar67 = 0;
    iVar70 = 0;
    uVar63 = 0;
    do {
      UVar4 = local_138._1_1_;
      UVar79 = s->unseqToSeq
               [pUVar82[(int)(((int)(pUVar68[lVar67] - 1) >> 0x1f & (uint)uVar81) + pUVar68[lVar67]
                             + -1)]];
      if ((UChar)local_138 == UVar79) {
        iVar70 = iVar70 + 1;
      }
      else {
        if (0 < iVar70) {
          uVar71 = iVar70 - 1;
          uVar81 = (ulong)(int)uVar63;
          pUVar74 = pUVar59 + uVar81;
          while( true ) {
            uVar63 = (int)uVar81 + 1;
            uVar81 = (ulong)uVar63;
            if ((uVar71 & 1) == 0) {
              *pUVar74 = 0;
              s->mtfFreq[0] = s->mtfFreq[0] + 1;
            }
            else {
              *pUVar74 = 1;
              s->mtfFreq[1] = s->mtfFreq[1] + 1;
            }
            if ((int)uVar71 < 2) break;
            uVar71 = uVar71 - 2 >> 1;
            pUVar74 = pUVar74 + 1;
          }
          iVar70 = 0;
        }
        local_138._1_1_ = (UChar)local_138;
        puVar61 = &local_138;
        while (UVar79 != UVar4) {
          UVar3 = *(UChar *)((long)puVar61 + 2);
          *(UChar *)((long)puVar61 + 2) = UVar4;
          UVar4 = UVar3;
          puVar61 = (undefined4 *)((long)puVar61 + 1);
        }
        local_138._0_1_ = UVar4;
        iVar65 = ((int)(undefined4 *)((long)puVar61 + 1) - (int)&local_138) + 1;
        pUVar59[(int)uVar63] = (UInt16)iVar65;
        uVar63 = uVar63 + 1;
        s->mtfFreq[iVar65] = s->mtfFreq[iVar65] + 1;
      }
      lVar67 = lVar67 + 1;
      uVar81 = (ulong)s->nblock;
    } while (lVar67 < (long)uVar81);
  }
  if (0 < iVar70) {
    uVar71 = iVar70 - 1;
    uVar81 = (ulong)(int)uVar63;
    pUVar74 = pUVar59 + uVar81;
    while( true ) {
      uVar63 = (int)uVar81 + 1;
      uVar81 = (ulong)uVar63;
      if ((uVar71 & 1) == 0) {
        *pUVar74 = 0;
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      else {
        *pUVar74 = 1;
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      if ((int)uVar71 < 2) break;
      uVar71 = uVar71 - 2 >> 1;
      pUVar74 = pUVar74 + 1;
    }
  }
  pUVar59[(int)uVar63] = (short)iVar62 + 1;
  s->mtfFreq[lVar66 + 1] = s->mtfFreq[lVar66 + 1] + 1;
  s->nMTF = uVar63 + 1;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      %d in block, %d after MTF & 1-2 coding, %d+2 syms in use\n",
            (ulong)(uint)s->nblock,(ulong)(uVar63 + 1),(ulong)(uint)s->nInUse);
  }
  iVar62 = s->nInUse;
  uVar63 = iVar62 + 2;
  __n = 1;
  if (1 < (int)uVar63) {
    __n = (size_t)uVar63;
  }
  paUVar1 = s->len;
  lVar66 = 0;
  do {
    if (-2 < iVar62) {
      memset(*paUVar1 + lVar66,0xf,__n);
    }
    lVar66 = lVar66 + 0x102;
  } while (lVar66 != 0x60c);
  if (s->nMTF < 1) {
    BZ2_bz__AssertH__fail(0xbb9);
  }
  iVar70 = s->nMTF;
  uVar81 = 0;
  if (iVar70 < 200) {
    uVar71 = 2;
LAB_0041dd11:
    bVar60 = false;
  }
  else {
    if (iVar70 < 600) {
      uVar71 = 3;
      goto LAB_0041dd11;
    }
    if (iVar70 < 0x4b0) {
      uVar71 = 4;
      goto LAB_0041dd11;
    }
    bVar60 = 0x95f < iVar70;
    uVar71 = bVar60 + 5;
  }
  uVar87 = (ulong)uVar71;
  pUVar82 = s->selectorMtf + (ulong)(uVar71 * 0x102) + 0x4550;
  uVar80 = uVar87;
  local_168 = s->inUse;
  do {
    iVar64 = iVar70 / (int)uVar80;
    iVar65 = (int)uVar81;
    uVar84 = iVar65 - 1;
    uVar86 = (ulong)uVar84;
    uVar77 = 0;
    if ((0 < iVar64) && ((int)uVar84 <= iVar62)) {
      uVar77 = 0;
      uVar85 = (long)(int)uVar84;
      do {
        uVar84 = (int)uVar77 + s->mtfFreq[uVar85 + 1];
        uVar77 = (ulong)uVar84;
        uVar86 = uVar85 + 1;
        if ((long)iVar62 <= (long)uVar85) break;
        uVar85 = uVar86;
      } while ((int)uVar84 < iVar64);
    }
    iVar64 = (int)uVar86;
    if (((iVar65 < iVar64) && (uVar80 != 1 && uVar80 != uVar87)) &&
       ((uVar71 - (int)uVar80 & 0x80000001) == 1)) {
      uVar77 = (ulong)(uint)((int)uVar77 - s->mtfFreq[iVar64]);
      uVar86 = (ulong)(iVar64 - 1);
    }
    if (2 < s->verbosity) {
      fprintf(_stderr,"      initial group %d, [%d .. %d], has %d syms (%4.1f%%)\n",
              ((double)(int)uVar77 * 100.0) / (double)s->nMTF,uVar80 & 0xffffffff,uVar81,
              uVar86 & 0xffffffff,uVar77);
    }
    if (-2 < iVar62) {
      sVar75 = 0;
      do {
        UVar79 = '\0';
        if ((long)(int)uVar86 < (long)sVar75) {
          UVar79 = '\x0f';
        }
        if ((long)sVar75 < (long)iVar65) {
          UVar79 = '\x0f';
        }
        pUVar82[sVar75] = UVar79;
        sVar75 = sVar75 + 1;
      } while (__n != sVar75);
    }
    iVar70 = iVar70 - (int)uVar77;
    pUVar82 = pUVar82 + -0x102;
    uVar81 = (ulong)((int)uVar86 + 1);
    bVar69 = 1 < (long)uVar80;
    uVar80 = uVar80 - 1;
  } while (bVar69);
  local_1a0 = s->rfreq;
  local_150 = (size_t)(uVar71 * 4);
  local_158 = __n * 4;
  local_140 = (ulong)(uVar71 * 2);
  local_178 = (ulong)(uVar71 * 0x408);
  local_160 = s->len_pack[0] + 2;
  local_148 = s->len;
  local_180 = 0;
  do {
    sVar75 = local_158;
    paIVar78 = local_1a0;
    memset(&local_138,0,local_150);
    uVar81 = 0;
    do {
      if (-2 < iVar62) {
        memset((void *)((long)*paIVar78 + uVar81),0,sVar75);
      }
      uVar81 = uVar81 + 0x408;
    } while (local_178 != uVar81);
    if ((bool)(-2 < iVar62 & bVar60)) {
      sVar75 = 0;
      pUVar68 = local_160;
      do {
        (*(UInt32 (*) [4])(pUVar68 + -2))[0] =
             (uint)s->len[0][sVar75] | (uint)s->len[1][sVar75] << 0x10;
        pUVar68[-1] = (uint)s->len[2][sVar75] | (uint)s->len[3][sVar75] << 0x10;
        *pUVar68 = (uint)s->len[4][sVar75] | (uint)s->len[5][sVar75] << 0x10;
        sVar75 = sVar75 + 1;
        pUVar68 = pUVar68 + 4;
      } while (__n != sVar75);
    }
    iVar70 = s->nMTF;
    if (iVar70 < 1) {
      local_1e0 = 0;
    }
    else {
      local_1e0 = 0;
      iVar65 = 0;
      do {
        memset(&local_1ac,0,local_140);
        paUVar83 = local_148;
        paIVar78 = local_1a0;
        iVar64 = iVar70 + -1;
        if (iVar65 + 0x31 < iVar70) {
          iVar64 = iVar65 + 0x31;
        }
        bVar69 = (bool)(iVar64 - iVar65 == 0x31 & bVar60);
        if (bVar69) {
          uVar7 = pUVar59[iVar65];
          uVar8 = pUVar59[(long)iVar65 + 1];
          uVar9 = pUVar59[(long)iVar65 + 2];
          uVar10 = pUVar59[(long)iVar65 + 3];
          uVar11 = pUVar59[(long)iVar65 + 4];
          uVar12 = pUVar59[(long)iVar65 + 5];
          uVar13 = pUVar59[(long)iVar65 + 6];
          uVar14 = pUVar59[(long)iVar65 + 7];
          uVar15 = pUVar59[(long)iVar65 + 8];
          uVar16 = pUVar59[(long)iVar65 + 9];
          uVar17 = pUVar59[(long)iVar65 + 10];
          uVar18 = pUVar59[(long)iVar65 + 0xb];
          uVar19 = pUVar59[(long)iVar65 + 0xc];
          uVar20 = pUVar59[(long)iVar65 + 0xd];
          uVar21 = pUVar59[(long)iVar65 + 0xe];
          uVar22 = pUVar59[(long)iVar65 + 0xf];
          uVar23 = pUVar59[(long)iVar65 + 0x10];
          uVar24 = pUVar59[(long)iVar65 + 0x11];
          uVar25 = pUVar59[(long)iVar65 + 0x12];
          uVar26 = pUVar59[(long)iVar65 + 0x13];
          uVar27 = pUVar59[(long)iVar65 + 0x14];
          uVar28 = pUVar59[(long)iVar65 + 0x15];
          uVar29 = pUVar59[(long)iVar65 + 0x16];
          uVar30 = pUVar59[(long)iVar65 + 0x17];
          uVar31 = pUVar59[(long)iVar65 + 0x18];
          uVar32 = pUVar59[(long)iVar65 + 0x19];
          uVar33 = pUVar59[(long)iVar65 + 0x1a];
          uVar34 = pUVar59[(long)iVar65 + 0x1b];
          uVar35 = pUVar59[(long)iVar65 + 0x1c];
          uVar36 = pUVar59[(long)iVar65 + 0x1d];
          uVar37 = pUVar59[(long)iVar65 + 0x1e];
          uVar38 = pUVar59[(long)iVar65 + 0x1f];
          uVar39 = pUVar59[(long)iVar65 + 0x20];
          uVar40 = pUVar59[(long)iVar65 + 0x21];
          uVar41 = pUVar59[(long)iVar65 + 0x22];
          uVar42 = pUVar59[(long)iVar65 + 0x23];
          uVar43 = pUVar59[(long)iVar65 + 0x24];
          uVar44 = pUVar59[(long)iVar65 + 0x25];
          uVar45 = pUVar59[(long)iVar65 + 0x26];
          uVar46 = pUVar59[(long)iVar65 + 0x27];
          uVar47 = pUVar59[(long)iVar65 + 0x28];
          uVar48 = pUVar59[(long)iVar65 + 0x29];
          uVar49 = pUVar59[(long)iVar65 + 0x2a];
          uVar50 = pUVar59[(long)iVar65 + 0x2b];
          uVar51 = pUVar59[(long)iVar65 + 0x2c];
          uVar52 = pUVar59[(long)iVar65 + 0x2d];
          uVar53 = pUVar59[(long)iVar65 + 0x2e];
          uVar54 = pUVar59[(long)iVar65 + 0x2f];
          uVar55 = pUVar59[(long)iVar65 + 0x30];
          uVar56 = pUVar59[(long)iVar65 + 0x31];
          local_1ac = s->len_pack[uVar8][0] + s->len_pack[uVar7][0] + s->len_pack[uVar9][0] +
                      s->len_pack[uVar10][0] + s->len_pack[uVar11][0] + s->len_pack[uVar12][0] +
                      s->len_pack[uVar13][0] + s->len_pack[uVar14][0] + s->len_pack[uVar15][0] +
                      s->len_pack[uVar16][0] + s->len_pack[uVar17][0] + s->len_pack[uVar18][0] +
                      s->len_pack[uVar19][0] + s->len_pack[uVar20][0] + s->len_pack[uVar21][0] +
                      s->len_pack[uVar22][0] + s->len_pack[uVar23][0] + s->len_pack[uVar24][0] +
                      s->len_pack[uVar25][0] + s->len_pack[uVar26][0] + s->len_pack[uVar27][0] +
                      s->len_pack[uVar28][0] + s->len_pack[uVar29][0] + s->len_pack[uVar30][0] +
                      s->len_pack[uVar31][0] + s->len_pack[uVar32][0] + s->len_pack[uVar33][0] +
                      s->len_pack[uVar34][0] + s->len_pack[uVar35][0] + s->len_pack[uVar36][0] +
                      s->len_pack[uVar37][0] + s->len_pack[uVar38][0] + s->len_pack[uVar39][0] +
                      s->len_pack[uVar40][0] + s->len_pack[uVar41][0] + s->len_pack[uVar42][0] +
                      s->len_pack[uVar43][0] + s->len_pack[uVar44][0] + s->len_pack[uVar45][0] +
                      s->len_pack[uVar46][0] + s->len_pack[uVar47][0] + s->len_pack[uVar48][0] +
                      s->len_pack[uVar49][0] + s->len_pack[uVar50][0] + s->len_pack[uVar51][0] +
                      s->len_pack[uVar52][0] + s->len_pack[uVar53][0] + s->len_pack[uVar54][0] +
                      s->len_pack[uVar55][0] + s->len_pack[uVar56][0];
          local_1a8 = s->len_pack[uVar8][1] + s->len_pack[uVar7][1] + s->len_pack[uVar9][1] +
                      s->len_pack[uVar10][1] + s->len_pack[uVar11][1] + s->len_pack[uVar12][1] +
                      s->len_pack[uVar13][1] + s->len_pack[uVar14][1] + s->len_pack[uVar15][1] +
                      s->len_pack[uVar16][1] + s->len_pack[uVar17][1] + s->len_pack[uVar18][1] +
                      s->len_pack[uVar19][1] + s->len_pack[uVar20][1] + s->len_pack[uVar21][1] +
                      s->len_pack[uVar22][1] + s->len_pack[uVar23][1] + s->len_pack[uVar24][1] +
                      s->len_pack[uVar25][1] + s->len_pack[uVar26][1] + s->len_pack[uVar27][1] +
                      s->len_pack[uVar28][1] + s->len_pack[uVar29][1] + s->len_pack[uVar30][1] +
                      s->len_pack[uVar31][1] + s->len_pack[uVar32][1] + s->len_pack[uVar33][1] +
                      s->len_pack[uVar34][1] + s->len_pack[uVar35][1] + s->len_pack[uVar36][1] +
                      s->len_pack[uVar37][1] + s->len_pack[uVar38][1] + s->len_pack[uVar39][1] +
                      s->len_pack[uVar40][1] + s->len_pack[uVar41][1] + s->len_pack[uVar42][1] +
                      s->len_pack[uVar43][1] + s->len_pack[uVar44][1] + s->len_pack[uVar45][1] +
                      s->len_pack[uVar46][1] + s->len_pack[uVar47][1] + s->len_pack[uVar48][1] +
                      s->len_pack[uVar49][1] + s->len_pack[uVar50][1] + s->len_pack[uVar51][1] +
                      s->len_pack[uVar52][1] + s->len_pack[uVar53][1] + s->len_pack[uVar54][1] +
                      s->len_pack[uVar55][1] + s->len_pack[uVar56][1];
          local_1a4 = s->len_pack[uVar8][2] + s->len_pack[uVar7][2] + s->len_pack[uVar9][2] +
                      s->len_pack[uVar10][2] + s->len_pack[uVar11][2] + s->len_pack[uVar12][2] +
                      s->len_pack[uVar13][2] + s->len_pack[uVar14][2] + s->len_pack[uVar15][2] +
                      s->len_pack[uVar16][2] + s->len_pack[uVar17][2] + s->len_pack[uVar18][2] +
                      s->len_pack[uVar19][2] + s->len_pack[uVar20][2] + s->len_pack[uVar21][2] +
                      s->len_pack[uVar22][2] + s->len_pack[uVar23][2] + s->len_pack[uVar24][2] +
                      s->len_pack[uVar25][2] + s->len_pack[uVar26][2] + s->len_pack[uVar27][2] +
                      s->len_pack[uVar28][2] + s->len_pack[uVar29][2] + s->len_pack[uVar30][2] +
                      s->len_pack[uVar31][2] + s->len_pack[uVar32][2] + s->len_pack[uVar33][2] +
                      s->len_pack[uVar34][2] + s->len_pack[uVar35][2] + s->len_pack[uVar36][2] +
                      s->len_pack[uVar37][2] + s->len_pack[uVar38][2] + s->len_pack[uVar39][2] +
                      s->len_pack[uVar40][2] + s->len_pack[uVar41][2] + s->len_pack[uVar42][2] +
                      s->len_pack[uVar43][2] + s->len_pack[uVar44][2] + s->len_pack[uVar45][2] +
                      s->len_pack[uVar46][2] + s->len_pack[uVar47][2] + s->len_pack[uVar48][2] +
                      s->len_pack[uVar49][2] + s->len_pack[uVar50][2] + s->len_pack[uVar51][2] +
                      s->len_pack[uVar52][2] + s->len_pack[uVar53][2] + s->len_pack[uVar54][2] +
                      s->len_pack[uVar55][2] + s->len_pack[uVar56][2];
        }
        else if (iVar65 <= iVar64) {
          lVar66 = (long)iVar65;
          do {
            pUVar82 = *paUVar83 + pUVar59[lVar66];
            uVar81 = 0;
            do {
              psVar2 = (short *)((long)&local_1ac + uVar81 * 2);
              *psVar2 = *psVar2 + (ushort)*pUVar82;
              uVar81 = uVar81 + 1;
              pUVar82 = pUVar82 + 0x102;
            } while (uVar87 != uVar81);
            lVar66 = lVar66 + 1;
          } while (iVar64 + 1 != (int)lVar66);
        }
        uVar81 = 0xffffffff;
        uVar80 = 0;
        uVar84 = 999999999;
        do {
          uVar7 = *(ushort *)((long)&local_1ac + uVar80 * 2);
          uVar73 = (uint)uVar7;
          if (uVar84 < uVar7) {
            uVar73 = uVar84;
          }
          if (uVar7 < uVar84) {
            uVar81 = uVar80 & 0xffffffff;
          }
          uVar80 = uVar80 + 1;
          uVar84 = uVar73;
        } while (uVar87 != uVar80);
        iVar70 = (int)uVar81;
        (&local_138)[iVar70] = (&local_138)[iVar70] + 1;
        s->selector[local_1e0] = (UChar)uVar81;
        if (bVar69) {
          paIVar78[iVar70][pUVar59[iVar65]] = paIVar78[iVar70][pUVar59[iVar65]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 1]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 1]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 2]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 2]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 3]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 3]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 4]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 4]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 5]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 5]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 6]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 6]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 7]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 7]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 8]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 8]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 9]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 9]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 10]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 10]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0xb]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0xb]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0xc]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0xc]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0xd]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0xd]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0xe]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0xe]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0xf]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0xf]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x10]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x10]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x11]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x11]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x12]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x12]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x13]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x13]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x14]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x14]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x15]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x15]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x16]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x16]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x17]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x17]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x18]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x18]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x19]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x19]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1a]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1a]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1b]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1b]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1c]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1c]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1d]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1d]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1e]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1e]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1f]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x1f]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x20]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x20]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x21]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x21]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x22]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x22]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x23]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x23]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x24]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x24]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x25]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x25]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x26]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x26]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x27]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x27]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x28]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x28]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x29]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x29]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2a]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2a]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2b]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2b]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2c]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2c]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2d]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2d]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2e]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2e]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2f]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x2f]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x30]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x30]] + 1;
          paIVar78[iVar70][pUVar59[(long)iVar65 + 0x31]] =
               paIVar78[iVar70][pUVar59[(long)iVar65 + 0x31]] + 1;
        }
        else if (iVar65 <= iVar64) {
          lVar66 = 0;
          do {
            paIVar78[iVar70][pUVar59[iVar65 + lVar66]] =
                 paIVar78[iVar70][pUVar59[iVar65 + lVar66]] + 1;
            lVar66 = lVar66 + 1;
          } while ((iVar64 - iVar65) + 1 != (int)lVar66);
        }
        local_1e0 = local_1e0 + 1;
        iVar65 = iVar64 + 1;
        iVar70 = s->nMTF;
      } while (iVar65 < iVar70);
    }
    paIVar78 = local_1a0;
    paUVar83 = paUVar1;
    uVar81 = uVar87;
    if (2 < s->verbosity) {
      BZ2_compressBlock_cold_1();
      paIVar78 = local_1a0;
    }
    do {
      BZ2_hbMakeCodeLengths(*paUVar83,*paIVar78,uVar63,0x11);
      uVar81 = uVar81 - 1;
      paIVar78 = paIVar78 + 1;
      paUVar83 = paUVar83 + 1;
    } while (uVar81 != 0);
    uVar84 = (int)local_180 + 1;
    local_180 = (ulong)uVar84;
  } while (uVar84 != 4);
  uVar84 = (uint)local_1e0;
  if (0x4652 < uVar84) {
    BZ2_bz__AssertH__fail(0xbbb);
  }
  uVar81 = 0;
  do {
    local_198[uVar81] = (UChar)uVar81;
    uVar81 = uVar81 + 1;
  } while (uVar87 != uVar81);
  if (uVar84 != 0) {
    uVar81 = 0;
    do {
      UVar79 = s->selector[uVar81];
      lVar66 = 0;
      while (UVar79 != local_198[0]) {
        UVar4 = local_198[lVar66 + 1];
        local_198[lVar66 + 1] = local_198[0];
        lVar66 = lVar66 + 1;
        local_198[0] = UVar4;
      }
      s->selectorMtf[uVar81] = (UChar)lVar66;
      uVar81 = uVar81 + 1;
    } while (uVar81 != (local_1e0 & 0xffffffff));
  }
  uVar81 = 0;
  paUVar83 = paUVar1;
  local_178 = local_1e0 & 0xffffffff;
  do {
    minLen = 0x20;
    uVar73 = 0;
    if (-2 < iVar62) {
      sVar75 = 0;
      uVar73 = 0;
      do {
        uVar72 = (uint)(*paUVar83)[sVar75];
        if (uVar73 <= (*paUVar83)[sVar75]) {
          uVar73 = uVar72;
        }
        if (uVar72 <= minLen) {
          minLen = uVar72;
        }
        sVar75 = sVar75 + 1;
      } while (__n != sVar75);
    }
    if (0x11 < uVar73) {
      BZ2_bz__AssertH__fail(0xbbc);
    }
    if (minLen == 0) {
      BZ2_bz__AssertH__fail(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[uVar81],paUVar1[uVar81],minLen,uVar73,uVar63);
    uVar80 = local_178;
    uVar81 = uVar81 + 1;
    paUVar83 = paUVar83 + 1;
  } while (uVar81 != uVar87);
  lVar66 = 0;
  pBVar76 = local_168;
  do {
    local_198[lVar66] = '\0';
    lVar67 = 0;
    do {
      if (pBVar76[lVar67] != '\0') {
        local_198[lVar66] = '\x01';
      }
      lVar67 = lVar67 + 1;
    } while (lVar67 != 0x10);
    lVar66 = lVar66 + 1;
    pBVar76 = pBVar76 + 0x10;
  } while (lVar66 != 0x10);
  iVar70 = s->numZ;
  lVar66 = 0;
  do {
    iVar65 = s->bsLive;
    if (local_198[lVar66] == '\0') {
      if (7 < iVar65) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar64 = s->bsLive;
          iVar65 = iVar64 + -8;
          s->bsLive = iVar65;
        } while (0xf < iVar64);
      }
    }
    else {
      if (7 < iVar65) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar64 = s->bsLive;
          iVar65 = iVar64 + -8;
          s->bsLive = iVar65;
        } while (0xf < iVar64);
      }
      s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar65 & 0x1f);
    }
    s->bsLive = iVar65 + 1;
    lVar66 = lVar66 + 1;
  } while (lVar66 != 0x10);
  lVar66 = 0;
  do {
    if (local_198[lVar66] != '\0') {
      lVar67 = 0;
      do {
        iVar65 = s->bsLive;
        if (s->inUse[lVar67 + lVar66 * 0x10] == '\0') {
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar64 = s->bsLive;
              iVar65 = iVar64 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar64);
          }
        }
        else {
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar64 = s->bsLive;
              iVar65 = iVar64 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar64);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar65 & 0x1f);
        }
        s->bsLive = iVar65 + 1;
        lVar67 = lVar67 + 1;
      } while (lVar67 != 0x10);
    }
    lVar66 = lVar66 + 1;
  } while (lVar66 != 0x10);
  if (2 < s->verbosity) {
    fprintf(_stderr,"      bytes: mapping %d, ",(ulong)(uint)(s->numZ - iVar70));
  }
  iVar65 = s->numZ;
  iVar70 = s->bsLive;
  if (7 < iVar70) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar64 = s->bsLive;
      iVar70 = iVar64 + -8;
      s->bsLive = iVar70;
    } while (0xf < iVar64);
  }
  s->bsBuff = s->bsBuff | uVar71 << (0x1dU - (char)iVar70 & 0x1f);
  iVar70 = iVar70 + 3;
  s->bsLive = iVar70;
  if (7 < iVar70) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar64 = s->bsLive;
      iVar70 = iVar64 + -8;
      s->bsLive = iVar70;
    } while (0xf < iVar64);
  }
  s->bsBuff = s->bsBuff | uVar84 << (0x11U - (char)iVar70 & 0x1f);
  s->bsLive = iVar70 + 0xf;
  if (uVar84 != 0) {
    uVar81 = 0;
    do {
      if (s->selectorMtf[uVar81] != '\0') {
        uVar63 = 0;
        do {
          iVar70 = s->bsLive;
          if (7 < iVar70) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar64 = s->bsLive;
              iVar70 = iVar64 + -8;
              s->bsLive = iVar70;
            } while (0xf < iVar64);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar70 & 0x1f);
          s->bsLive = iVar70 + 1;
          uVar63 = uVar63 + 1;
        } while (uVar63 < s->selectorMtf[uVar81]);
      }
      iVar70 = s->bsLive;
      if (7 < iVar70) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar64 = s->bsLive;
          iVar70 = iVar64 + -8;
          s->bsLive = iVar70;
        } while (0xf < iVar64);
      }
      s->bsLive = iVar70 + 1;
      uVar81 = uVar81 + 1;
    } while (uVar81 != uVar80);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"selectors %d, ",(ulong)(uint)(s->numZ - iVar65));
  }
  iVar70 = s->numZ;
  uVar81 = 0;
  do {
    bVar5 = paUVar1[uVar81][0];
    uVar63 = (uint)bVar5;
    iVar65 = s->bsLive;
    if (7 < iVar65) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar64 = s->bsLive;
        iVar65 = iVar64 + -8;
        s->bsLive = iVar65;
      } while (0xf < iVar64);
    }
    s->bsBuff = s->bsBuff | (uint)bVar5 << (0x1bU - (char)iVar65 & 0x1f);
    s->bsLive = iVar65 + 5;
    if (-2 < iVar62) {
      sVar75 = 0;
      do {
        bVar5 = paUVar1[uVar81][sVar75];
        for (; (int)uVar63 < (int)(uint)bVar5; uVar63 = uVar63 + 1) {
          iVar65 = s->bsLive;
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar64 = s->bsLive;
              iVar65 = iVar64 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar64);
          }
          s->bsBuff = s->bsBuff | 2 << (0x1eU - (char)iVar65 & 0x1f);
          s->bsLive = iVar65 + 2;
          bVar5 = paUVar1[uVar81][sVar75];
        }
        for (; (int)(uint)paUVar1[uVar81][sVar75] < (int)uVar63; uVar63 = uVar63 - 1) {
          iVar65 = s->bsLive;
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar64 = s->bsLive;
              iVar65 = iVar64 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar64);
          }
          s->bsBuff = s->bsBuff | 3 << (0x1eU - (char)iVar65 & 0x1f);
          s->bsLive = iVar65 + 2;
        }
        iVar65 = s->bsLive;
        if (7 < iVar65) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar64 = s->bsLive;
            iVar65 = iVar64 + -8;
            s->bsLive = iVar65;
          } while (0xf < iVar64);
        }
        s->bsLive = iVar65 + 1;
        sVar75 = sVar75 + 1;
      } while (sVar75 != __n);
    }
    uVar81 = uVar81 + 1;
  } while (uVar81 != uVar87);
  if (2 < s->verbosity) {
    fprintf(_stderr,"code lengths %d, ",(ulong)(uint)(s->numZ - iVar70));
  }
  iVar62 = s->numZ;
  iVar70 = s->nMTF;
  lVar66 = 0;
  if (0 < iVar70) {
    iVar65 = 0;
    do {
      iVar64 = iVar70 + -1;
      if (iVar65 + 0x31 < iVar70) {
        iVar64 = iVar65 + 0x31;
      }
      if (uVar71 <= s->selector[lVar66]) {
        BZ2_bz__AssertH__fail(0xbbe);
      }
      if ((bool)(bVar60 & iVar64 - iVar65 == 0x31)) {
        bVar5 = s->selector[lVar66];
        uVar80 = (ulong)bVar5;
        lVar67 = (ulong)bVar5 * 0x100 + uVar80 * 2;
        uVar81 = (ulong)bVar5;
        bVar5 = (*paUVar1)[(ulong)pUVar59[iVar65] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[iVar65]];
        iVar70 = s->bsLive;
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 1] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 1]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 2] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 2]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 3] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 3]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 4] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 4]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 5] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 5]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 6] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 6]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 7] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 7]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 8] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 8]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 9] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 9]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 10] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 10]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0xb] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0xb]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0xc] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0xc]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0xd] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0xd]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0xe] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0xe]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0xf] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0xf]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x10] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x10]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x11] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x11]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x12] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x12]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x13] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x13]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x14] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x14]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x15] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x15]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x16] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x16]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x17] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x17]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x18] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x18]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x19] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x19]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x1a] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x1a]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x1b] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x1b]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x1c] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x1c]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x1d] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x1d]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x1e] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x1e]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x1f] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x1f]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x20] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x20]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x21] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x21]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x22] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x22]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x23] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x23]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x24] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x24]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x25] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x25]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x26] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x26]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x27] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x27]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x28] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x28]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x29] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x29]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x2a] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x2a]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x2b] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x2b]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x2c] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x2c]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x2d] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x2d]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x2e] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x2e]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x2f] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x2f]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x30] + lVar67];
        iVar57 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x30]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar70 = iVar58 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar58);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar57 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
        bVar5 = (*paUVar1)[(ulong)pUVar59[(long)iVar65 + 0x31] + lVar67];
        iVar65 = s->code[0][uVar80 * 2 + uVar81 * 0x100 + (ulong)pUVar59[(long)iVar65 + 0x31]];
        if (7 < iVar70) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar57 = s->bsLive;
            iVar70 = iVar57 + -8;
            s->bsLive = iVar70;
          } while (0xf < iVar57);
        }
        iVar70 = iVar70 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar65 << (-(char)iVar70 & 0x1fU);
        s->bsLive = iVar70;
      }
      else if (iVar65 <= iVar64) {
        lVar67 = (long)iVar65;
        do {
          bVar5 = s->selector[lVar66];
          bVar6 = (*paUVar1)[(ulong)pUVar59[lVar67] + (ulong)bVar5 * 0x100 + (ulong)bVar5 * 2];
          iVar65 = s->code[0][(ulong)bVar5 * 2 + (ulong)bVar5 * 0x100 + (ulong)pUVar59[lVar67]];
          iVar70 = s->bsLive;
          if (7 < iVar70) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar57 = s->bsLive;
              iVar70 = iVar57 + -8;
              s->bsLive = iVar70;
            } while (0xf < iVar57);
          }
          iVar70 = iVar70 + (uint)bVar6;
          s->bsBuff = s->bsBuff | iVar65 << (-(char)iVar70 & 0x1fU);
          s->bsLive = iVar70;
          lVar67 = lVar67 + 1;
        } while (iVar64 + 1 != (int)lVar67);
      }
      iVar65 = iVar64 + 1;
      lVar66 = lVar66 + 1;
      iVar70 = s->nMTF;
    } while (iVar65 < iVar70);
  }
  if ((uint)lVar66 != uVar84) {
    BZ2_bz__AssertH__fail(0xbbf);
  }
  is_last_block = (Bool_conflict)local_16c;
  if (2 < s->verbosity) {
    fprintf(_stderr,"codes %d\n",(ulong)(uint)(s->numZ - iVar62));
  }
LAB_00420241:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (1 < s->verbosity) {
      BZ2_compressBlock_cold_2();
    }
    if (0 < s->bsLive) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar62 = s->bsLive;
        s->bsLive = iVar62 + -8;
      } while (8 < iVar62);
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}